

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::~BoardView(BoardView *this)

{
  long *in_RDI;
  Confparse *in_stack_ffffffffffffffc0;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)((long)in_RDI + 0xd6b2) & 1) != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x10))();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)0x11c6a3);
    (**(code **)(*(long *)in_RDI[1] + 0x20))();
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x11c6c6);
    (**(code **)(*(long *)in_RDI[1] + 0x18))();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               0x11c6e9);
    in_stack_ffffffffffffffd0 =
         (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
         (**(code **)(*(long *)in_RDI[1] + 0x28))();
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)0x11c70c)
    ;
    (**(code **)(*(long *)in_RDI[1] + 0x30))();
    std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::clear
              ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
               0x11c72f);
    in_stack_ffffffffffffffc0 = (Confparse *)*in_RDI;
    if (in_stack_ffffffffffffffc0 != (Confparse *)0x0) {
      (**(code **)(*(long *)&(in_stack_ffffffffffffffc0->filepath)._M_pathname + 8))();
    }
    if ((long *)in_RDI[1] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[1] + 8))();
    }
    Annotations::Close((Annotations *)in_stack_ffffffffffffffc0);
    *(undefined1 *)((long)in_RDI + 0xd6b2) = 0;
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x1ad7));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1ab3));
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
            ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             in_stack_ffffffffffffffd0);
  ImVector<char>::~ImVector((ImVector<char> *)in_stack_ffffffffffffffc0);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (in_stack_ffffffffffffffd0);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::~vector
            ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
             in_stack_ffffffffffffffd0);
  std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x11c800);
  std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x11c811);
  std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x11c822);
  std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x11c833);
  Annotations::~Annotations((Annotations *)in_stack_ffffffffffffffc0);
  PDFFile::~PDFFile((PDFFile *)in_stack_ffffffffffffffc0);
  PDFBridgeEvince::~PDFBridgeEvince((PDFBridgeEvince *)in_stack_ffffffffffffffc0);
  Preferences::BoardSettings::~BoardSettings((BoardSettings *)in_stack_ffffffffffffffc0);
  Preferences::Keyboard::~Keyboard((Keyboard *)in_stack_ffffffffffffffc0);
  Preferences::Program::~Program((Program *)0x11c899);
  Config::~Config((Config *)in_stack_ffffffffffffffc0);
  KeyBindings::~KeyBindings((KeyBindings *)in_stack_ffffffffffffffc0);
  SpellCorrector::~SpellCorrector((SpellCorrector *)0x11c8cc);
  SpellCorrector::~SpellCorrector((SpellCorrector *)0x11c8dd);
  Searcher::~Searcher((Searcher *)in_stack_ffffffffffffffc0);
  FHistory::~FHistory((FHistory *)0x11c8ff);
  Confparse::~Confparse(in_stack_ffffffffffffffc0);
  BackgroundImage::~BackgroundImage((BackgroundImage *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

BoardView::~BoardView() {
	if (m_validBoard) {
		m_board->Nets().clear();
		m_board->Pins().clear();
		m_board->Components().clear();
		m_board->OutlinePoints().clear();
		m_board->OutlineSegments().clear();
		delete m_file;
		delete m_board;
		m_annotations.Close();
		m_validBoard = false;
	}
}